

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DTDElementDecl.cpp
# Opt level: O3

DTDAttDef * __thiscall xercesc_4_0::DTDElementDecl::getAttDef(DTDElementDecl *this,XMLCh *attName)

{
  RefHashTableOf<xercesc_4_0::DTDAttDef,_xercesc_4_0::StringHasher> *pRVar1;
  bool bVar2;
  ulong uVar3;
  XMLCh *pXVar4;
  XMLCh XVar5;
  RefHashTableBucketElem<xercesc_4_0::DTDAttDef> *pRVar6;
  
  pRVar1 = this->fAttDefs;
  if (pRVar1 != (RefHashTableOf<xercesc_4_0::DTDAttDef,_xercesc_4_0::StringHasher> *)0x0) {
    if ((attName == (XMLCh *)0x0) || (uVar3 = (ulong)(ushort)*attName, uVar3 == 0)) {
      uVar3 = 0;
    }
    else {
      XVar5 = attName[1];
      if (XVar5 != L'\0') {
        pXVar4 = attName + 2;
        do {
          uVar3 = (ulong)(ushort)XVar5 + (uVar3 >> 0x18) + uVar3 * 0x26;
          XVar5 = *pXVar4;
          pXVar4 = pXVar4 + 1;
        } while (XVar5 != L'\0');
      }
      uVar3 = uVar3 % pRVar1->fHashModulus;
    }
    pRVar6 = pRVar1->fBucketList[uVar3];
    if (pRVar6 != (RefHashTableBucketElem<xercesc_4_0::DTDAttDef> *)0x0) {
      do {
        bVar2 = StringHasher::equals((StringHasher *)&pRVar1->field_0x30,attName,pRVar6->fKey);
        if (bVar2) {
          return pRVar6->fData;
        }
        pRVar6 = pRVar6->fNext;
      } while (pRVar6 != (RefHashTableBucketElem<xercesc_4_0::DTDAttDef> *)0x0);
      return (DTDAttDef *)0x0;
    }
  }
  return (DTDAttDef *)0x0;
}

Assistant:

DTDAttDef* DTDElementDecl::getAttDef(const XMLCh* const attName)
{
    // If no list, then return a null
    if (!fAttDefs)
        return 0;

    return fAttDefs->get(attName);
}